

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

void __thiscall
cppnet::TimerContainer::DoTimer
          (TimerContainer *this,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *run_timer_solts,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *sub_timer_solts)

{
  bool bVar1;
  uint32_t uVar2;
  element_type *peVar3;
  element_type *peVar4;
  shared_ptr<cppnet::TimerSlot> local_c0;
  undefined1 local_b0 [8];
  shared_ptr<cppnet::TimerSlot> ptr_1;
  __normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
  local_98;
  iterator iter_1;
  weak_ptr<cppnet::TimerSlot> local_88;
  weak_ptr<cppnet::TimerSlot> local_78;
  undefined1 local_68 [8];
  shared_ptr<cppnet::TimerContainer> root_timer;
  undefined1 local_40 [8];
  shared_ptr<cppnet::TimerSlot> ptr;
  __normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
  local_28;
  iterator iter;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  *sub_timer_solts_local;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  *run_timer_solts_local;
  TimerContainer *this_local;
  
  iter._M_current = (weak_ptr<cppnet::TimerSlot> *)sub_timer_solts;
  local_28._M_current =
       (weak_ptr<cppnet::TimerSlot> *)
       std::
       vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
       ::begin(run_timer_solts);
  while( true ) {
    ptr.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
         ::end(run_timer_solts);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
                        *)&ptr.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
    ::operator->(&local_28);
    std::weak_ptr<cppnet::TimerSlot>::lock((weak_ptr<cppnet::TimerSlot> *)local_40);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      (**peVar4->_vptr_TimerSlot)();
      peVar4 = std::__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      TimerSlot::RmInTimer(peVar4);
      peVar4 = std::__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      bVar1 = TimerSlot::IsAlways(peVar4);
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
        TimerSlot::ResetTime(peVar4);
        std::weak_ptr<cppnet::TimerContainer>::lock((weak_ptr<cppnet::TimerContainer> *)local_68);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
        if (bVar1) {
          peVar3 = std::
                   __shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_68);
          std::weak_ptr<cppnet::TimerSlot>::weak_ptr<cppnet::TimerSlot,void>
                    (&local_78,(shared_ptr<cppnet::TimerSlot> *)local_40);
          peVar4 = std::
                   __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          uVar2 = TimerSlot::GetTotalInterval(peVar4);
          peVar4 = std::
                   __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          bVar1 = TimerSlot::IsAlways(peVar4);
          (**(peVar3->super_Timer)._vptr_Timer)(peVar3,&local_78,(ulong)uVar2,(ulong)bVar1);
          std::weak_ptr<cppnet::TimerSlot>::~weak_ptr(&local_78);
        }
        else {
          std::weak_ptr<cppnet::TimerSlot>::weak_ptr<cppnet::TimerSlot,void>
                    (&local_88,(shared_ptr<cppnet::TimerSlot> *)local_40);
          peVar4 = std::
                   __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          uVar2 = TimerSlot::GetTotalInterval(peVar4);
          peVar4 = std::
                   __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          bVar1 = TimerSlot::IsAlways(peVar4);
          (**(this->super_Timer)._vptr_Timer)(this,&local_88,(ulong)uVar2,(ulong)bVar1);
          std::weak_ptr<cppnet::TimerSlot>::~weak_ptr(&local_88);
        }
        std::shared_ptr<cppnet::TimerContainer>::~shared_ptr
                  ((shared_ptr<cppnet::TimerContainer> *)local_68);
      }
    }
    std::shared_ptr<cppnet::TimerSlot>::~shared_ptr((shared_ptr<cppnet::TimerSlot> *)local_40);
    iter_1._M_current =
         (weak_ptr<cppnet::TimerSlot> *)
         __gnu_cxx::
         __normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
         ::operator++(&local_28,0);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_sub_timer);
  if (bVar1) {
    local_98._M_current =
         (weak_ptr<cppnet::TimerSlot> *)
         std::
         vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
         ::begin((vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                  *)iter._M_current);
    while( true ) {
      ptr_1.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
           ::end((vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                  *)iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_98,
                         (__normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
                          *)&ptr_1.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
      ::operator->(&local_98);
      std::weak_ptr<cppnet::TimerSlot>::lock((weak_ptr<cppnet::TimerSlot> *)local_b0);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b0);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->_sub_timer);
        std::shared_ptr<cppnet::TimerSlot>::shared_ptr
                  (&local_c0,(shared_ptr<cppnet::TimerSlot> *)local_b0);
        peVar4 = std::
                 __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b0);
        uVar2 = TimerSlot::GetLeftInterval(peVar4);
        InnerAddTimer(peVar3,&local_c0,uVar2);
        std::shared_ptr<cppnet::TimerSlot>::~shared_ptr(&local_c0);
      }
      std::shared_ptr<cppnet::TimerSlot>::~shared_ptr((shared_ptr<cppnet::TimerSlot> *)local_b0);
      __gnu_cxx::
      __normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
      ::operator++(&local_98,0);
    }
  }
  return;
}

Assistant:

void TimerContainer::DoTimer(std::vector<std::weak_ptr<TimerSlot>>& run_timer_solts,
    std::vector<std::weak_ptr<TimerSlot>>& sub_timer_solts) {
    // timer call back
    for (auto iter = run_timer_solts.begin(); iter != run_timer_solts.end(); iter++) {
        auto ptr = iter->lock();
        if (!ptr) {
            continue;
        }
        ptr->OnTimer();
        ptr->RmInTimer();

        // add timer again
        if (ptr->IsAlways()) {
            ptr->ResetTime();
            auto root_timer = _root_timer.lock();
            if (root_timer) {
                root_timer->AddTimer(ptr, ptr->GetTotalInterval(), ptr->IsAlways());
            }
            else {
                AddTimer(ptr, ptr->GetTotalInterval(), ptr->IsAlways());
            }
        }
    }

    // add sub timer
    if (!_sub_timer) {
        return;
    }
    for (auto iter = sub_timer_solts.begin(); iter != sub_timer_solts.end(); iter++) {
        auto ptr = iter->lock();
        if (!ptr) {
            continue;
        }
        _sub_timer->InnerAddTimer(ptr, ptr->GetLeftInterval());
    }
}